

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *matrix)

{
  long lVar1;
  complex<float> *pcVar2;
  pointer __p;
  int64_t i;
  ulong uVar3;
  pointer local_20;
  
  lVar1 = matrix->size_;
  if (lVar1 != this->size_) {
    this->size_ = lVar1;
    alloc_unique_array<std::complex<float>>((dense *)&local_20,lVar1 * lVar1);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>::reset
              ((__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> *)
               &this->data_,__p);
    std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
              ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
               &local_20);
  }
  pcVar2 = (matrix->data_)._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  for (uVar3 = 0; uVar3 < (ulong)(this->size_ * this->size_); uVar3 = uVar3 + 1) {
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[uVar3]._M_value =
         pcVar2[uVar3]._M_value;
  }
  return this;
}

Assistant:

SquareMatrix< T >& operator=( const SquareMatrix< T >& matrix ) {
          if ( matrix.size() != size_ ) {
            size_ = matrix.size() ;
            data_ = std::move( alloc_unique_array< T >( size_ * size_ ) ) ;
          }
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
          return *this ;
        }